

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool ImGui_EndFrame(SDL_Window *window)

{
  ImDrawData *pIVar1;
  undefined8 in_RDI;
  int display_h;
  int display_w;
  undefined4 local_10;
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  SDL_GetWindowSize(in_RDI,&local_c,&local_10);
  glViewport(0,0,local_c,local_10);
  glClearColor(0,0,0,0x3ecccccd);
  glClear(0x4000);
  ImGui::Render();
  pIVar1 = (ImDrawData *)ImGui::GetDrawData();
  ImGui_RenderDrawData(pIVar1);
  SDL_GL_SwapWindow(local_8);
  return true;
}

Assistant:

bool ImGui_EndFrame(SDL_Window * window) {
    // Rendering
    int display_w, display_h;
    SDL_GetWindowSize(window, &display_w, &display_h);
    glViewport(0, 0, display_w, display_h);
    glClearColor(0.0f, 0.0f, 0.0f, 0.4f);
    glClear(GL_COLOR_BUFFER_BIT);

    ImGui::Render();
    ImGui_RenderDrawData(ImGui::GetDrawData());

    SDL_GL_SwapWindow(window);

    return true;
}